

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O3

int consume_data(j_decompress_ptr cinfo)

{
  JDIMENSION JVar1;
  int iVar2;
  jpeg_d_coef_controller *pjVar3;
  long lVar4;
  boolean bVar5;
  int iVar6;
  JBLOCKARRAY ppaJVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  _func_void_j_decompress_ptr *p_Var14;
  long lVar15;
  long lVar16;
  JBLOCKARRAY buffer [4];
  long alStack_58 [5];
  
  pjVar3 = cinfo->coef;
  if (0 < cinfo->comps_in_scan) {
    lVar16 = 0;
    do {
      JVar1 = cinfo->cur_comp_info[lVar16]->v_samp_factor;
      ppaJVar7 = (*cinfo->mem->access_virt_barray)
                           ((j_common_ptr)cinfo,
                            (jvirt_barray_ptr)
                            (&pjVar3[3].start_output_pass)
                            [cinfo->cur_comp_info[lVar16]->component_index],
                            cinfo->input_iMCU_row * JVar1,JVar1,1);
      alStack_58[lVar16] = (long)ppaJVar7;
      lVar16 = lVar16 + 1;
    } while (lVar16 < cinfo->comps_in_scan);
  }
  iVar6 = *(int *)((long)&pjVar3[1].start_input_pass + 4);
  lVar16 = (long)iVar6;
  iVar10 = *(int *)&pjVar3[1].consume_data;
  if (iVar6 < iVar10) {
    uVar11 = *(uint *)&pjVar3[1].start_input_pass;
    uVar8 = cinfo->MCUs_per_row;
    do {
      if (uVar11 < uVar8) {
        do {
          iVar6 = cinfo->comps_in_scan;
          if (0 < (long)iVar6) {
            lVar9 = 0;
            iVar10 = 0;
            do {
              lVar12 = (long)cinfo->cur_comp_info[lVar9]->MCU_height;
              if (0 < lVar12) {
                iVar2 = cinfo->cur_comp_info[lVar9]->MCU_width;
                lVar4 = alStack_58[lVar9];
                lVar13 = 0;
                do {
                  if (0 < iVar2) {
                    p_Var14 = (_func_void_j_decompress_ptr *)
                              (*(long *)(lVar4 + lVar16 * 8 + lVar13 * 8) +
                              (ulong)(iVar2 * uVar11) * 0x80);
                    lVar15 = 0;
                    do {
                      (&pjVar3[1].start_output_pass)[iVar10 + lVar15] = p_Var14;
                      p_Var14 = p_Var14 + 0x80;
                      lVar15 = lVar15 + 1;
                    } while (iVar2 != (int)lVar15);
                    iVar10 = iVar10 + (int)lVar15;
                  }
                  lVar13 = lVar13 + 1;
                } while (lVar13 != lVar12);
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != iVar6);
          }
          bVar5 = (*cinfo->entropy->decode_mcu)(cinfo,(JBLOCKROW *)&pjVar3[1].start_output_pass);
          if (bVar5 == 0) {
            *(int *)((long)&pjVar3[1].start_input_pass + 4) = (int)lVar16;
            *(uint *)&pjVar3[1].start_input_pass = uVar11;
            return 0;
          }
          uVar11 = uVar11 + 1;
          uVar8 = cinfo->MCUs_per_row;
        } while (uVar11 < uVar8);
        iVar10 = *(int *)&pjVar3[1].consume_data;
      }
      *(undefined4 *)&pjVar3[1].start_input_pass = 0;
      lVar16 = lVar16 + 1;
      uVar11 = 0;
    } while (lVar16 < iVar10);
  }
  uVar11 = cinfo->input_iMCU_row + 1;
  cinfo->input_iMCU_row = uVar11;
  if (uVar11 < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    iVar6 = 3;
  }
  else {
    (*cinfo->inputctl->finish_input_pass)(cinfo);
    iVar6 = 4;
  }
  return iVar6;
}

Assistant:

METHODDEF(int)
consume_data (j_decompress_ptr cinfo)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  int blkn, ci, xindex, yindex, yoffset;
  JDIMENSION start_col;
  JBLOCKARRAY buffer[MAX_COMPS_IN_SCAN];
  JBLOCKROW buffer_ptr;
  jpeg_component_info *compptr;

  /* Align the virtual buffers for the components used in this scan. */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    buffer[ci] = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[compptr->component_index],
       cinfo->input_iMCU_row * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, TRUE);
    /* Note: entropy decoder expects buffer to be zeroed,
     * but this is handled automatically by the memory manager
     * because we requested a pre-zeroed array.
     */
  }

  /* Loop to process one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->MCU_ctr; MCU_col_num < cinfo->MCUs_per_row;
	 MCU_col_num++) {
      /* Construct list of pointers to DCT blocks belonging to this MCU */
      blkn = 0;			/* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	start_col = MCU_col_num * compptr->MCU_width;
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  buffer_ptr = buffer[ci][yindex+yoffset] + start_col;
	  for (xindex = 0; xindex < compptr->MCU_width; xindex++) {
	    coef->MCU_buffer[blkn++] = buffer_ptr++;
	  }
	}
      }
      /* Try to fetch the MCU. */
      if (! (*cinfo->entropy->decode_mcu) (cinfo, coef->MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->MCU_ctr = MCU_col_num;
	return JPEG_SUSPENDED;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->MCU_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  if (++(cinfo->input_iMCU_row) < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    return JPEG_ROW_COMPLETED;
  }
  /* Completed the scan */
  (*cinfo->inputctl->finish_input_pass) (cinfo);
  return JPEG_SCAN_COMPLETED;
}